

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::SetSourceInfo
          (ParseableFunctionInfo *this,uint sourceIndex,ParseNodeFnc *node,bool isEval,
          bool isDynamicFunction)

{
  undefined1 *puVar1;
  ulong uVar2;
  code *pcVar3;
  ULONG UVar4;
  bool bVar5;
  byte bVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  ulong uVar9;
  Recycler *alloc;
  PrintOffsets *ptr;
  FunctionBody *pFVar10;
  ulong uVar11;
  ulong uVar12;
  PrintOffsets PVar13;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  bVar6 = (this->super_FunctionProxy).field_0x47;
  if ((char)bVar6 < '\0') {
    if (this->m_sourceIndex != sourceIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb87,"(this->m_sourceIndex == sourceIndex)",
                                  "Mismatched source index");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
    }
    if (((this->super_FunctionProxy).field_0x46 & 0x10) == 0) {
      if (node->cbMin != (ulong)this->m_cbStartOffset) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8c,"(this->StartOffset() == node->cbMin)",
                                    "Mismatched source start offset");
        if (!bVar5) goto LAB_006cbb69;
        *puVar8 = 0;
      }
      cVar7 = this->m_cchStartOffset;
      if (cVar7 != (node->super_ParseNode).ichMin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8d,"(this->m_cchStartOffset == node->ichMin)",
                                    "Mismatched source character start offset");
        if (!bVar5) goto LAB_006cbb69;
        *puVar8 = 0;
        cVar7 = (node->super_ParseNode).ichMin;
      }
      if (this->m_cchLength != (node->super_ParseNode).ichLim - cVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8e,"(this->m_cchLength == node->LengthInCodepoints())",
                                    "Mismatched source length");
        if (!bVar5) goto LAB_006cbb69;
        *puVar8 = 0;
      }
      if (node->cbLim - node->cbMin != (ulong)this->m_cbLength) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb8f,"(this->LengthInBytes() == node->LengthInBytes())",
                                    "Mismatched source encoded byte length");
        if (!bVar5) goto LAB_006cbb69;
        *puVar8 = 0;
      }
    }
    bVar6 = (this->super_FunctionProxy).field_0x47;
    if ((bool)(bVar6 & 1) != isEval) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb92,"(this->m_isEval == isEval)","Mismatched source type");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
      bVar6 = (this->super_FunctionProxy).field_0x47;
    }
    if (((bVar6 & 2) == 0) == isDynamicFunction) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb93,"(this->m_isDynamicFunction == isDynamicFunction)",
                                  "Mismatch source type");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
    }
  }
  else {
    this->m_sourceIndex = sourceIndex;
    cVar7 = (node->super_ParseNode).ichMin;
    this->m_cchStartOffset = cVar7;
    this->m_cchLength = (node->super_ParseNode).ichLim - cVar7;
    UVar4 = node->columnNumber;
    this->m_lineNumber = node->lineNumber;
    this->m_columnNumber = UVar4;
    (this->super_FunctionProxy).field_0x47 = isDynamicFunction * '\x02' | isEval | bVar6 & 0x7c;
    uVar2 = node->cbMin;
    uVar12 = node->cbLim - uVar2;
    if ((uVar12 | uVar2) >> 0x20 != 0) {
      Throw::OutOfMemory();
    }
    uVar9 = node->cbStringMin;
    uVar11 = uVar2;
    if (uVar2 < uVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb70,"(node->cbStringMin <= node->cbMin)",
                                  "node->cbStringMin <= node->cbMin");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
      uVar11 = node->cbMin;
      uVar9 = node->cbStringMin;
    }
    this->m_cbStartOffset = (Type)uVar2;
    this->m_cbLength = (Type)uVar12;
    if (uVar9 != uVar11) {
      local_58 = (undefined1  [8])&PrintOffsets::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_29f156b;
      data.filename._0_4_ = 0xb76;
      alloc = Memory::Recycler::TrackAllocInfo
                        (((this->super_FunctionProxy).m_scriptContext)->recycler,
                         (TrackAllocData *)local_58);
      ptr = (PrintOffsets *)new<Memory::Recycler>(8,alloc,0x6db486);
      ptr->cbStartPrintOffset = 0;
      ptr->cbEndPrintOffset = 0;
      PVar13.cbEndPrintOffset = (uint)node->cbStringLim;
      PVar13.cbStartPrintOffset = (uint)node->cbStringMin;
      *ptr = PVar13;
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
                (&this->super_FunctionProxy,ptr);
    }
    if ((this->super_FunctionProxy).m_utf8SourceInfo.ptr == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb7c,"(this->m_utf8SourceInfo != nullptr)",
                                  "this->m_utf8SourceInfo != nullptr");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
    }
    puVar1 = &(this->super_FunctionProxy).field_0x47;
    *puVar1 = *puVar1 | 0x80;
    bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar5) {
      pFVar10 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      FunctionBody::FinishSourceInfo(pFVar10);
    }
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,FunctionSourceInfoParsePhase);
  if (bVar5) {
    if ((((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr ==
        (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xb9a,"(this->GetFunctionInfo()->HasBody())",
                                  "this->GetFunctionInfo()->HasBody()");
      if (!bVar5) goto LAB_006cbb69;
      *puVar8 = 0;
    }
    bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar5) {
      pFVar10 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      if (pFVar10 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb9e,"(functionBody != nullptr)","functionBody != nullptr");
        if (!bVar5) {
LAB_006cbb69:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      FunctionBody::PrintStatementSourceLineFromStartOffset
                (pFVar10,(pFVar10->super_ParseableFunctionInfo).m_cchStartOffset);
      Output::Flush();
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetSourceInfo(uint sourceIndex, ParseNodeFnc * node, bool isEval, bool isDynamicFunction)
    {
        if (!m_utf8SourceHasBeenSet)
        {
            this->m_sourceIndex = sourceIndex;
            this->m_cchStartOffset = node->ichMin;
            this->m_cchLength = node->LengthInCodepoints();
            this->m_lineNumber = node->lineNumber;
            this->m_columnNumber = node->columnNumber;
            this->m_isEval = isEval;
            this->m_isDynamicFunction = isDynamicFunction;

            // It would have been better if we detect and reject large source buffer earlier before parsing
            size_t cbMin = node->cbMin;
            size_t lengthInBytes = node->LengthInBytes();
            if (cbMin > UINT_MAX || lengthInBytes > UINT_MAX)
            {
                Js::Throw::OutOfMemory();
            }
            Assert(node->cbStringMin <= node->cbMin);
            this->m_cbStartOffset = (uint)cbMin;
            this->m_cbLength = (uint)lengthInBytes;

            if (node->cbStringMin != node->cbMin)
            {
                PrintOffsets* printOffsets = RecyclerNewLeaf(this->m_scriptContext->GetRecycler(), PrintOffsets);
                printOffsets->cbStartPrintOffset = (uint)node->cbStringMin;
                printOffsets->cbEndPrintOffset = (uint)node->cbStringLim;
                this->SetPrintOffsets(printOffsets);
            }

            Assert(this->m_utf8SourceInfo != nullptr);
            this->m_utf8SourceHasBeenSet = true;

            if (this->IsFunctionBody())
            {
                this->GetFunctionBody()->FinishSourceInfo();
            }
        }
#if DBG
        else
        {
            AssertMsg(this->m_sourceIndex == sourceIndex, "Mismatched source index");
            if (!this->GetIsGlobalFunc())
            {
                // In the global function case with a @cc_on, we modify some of these values so it might
                // not match on reparse (see ParseableFunctionInfo::Parse()).
                AssertMsg(this->StartOffset() == node->cbMin, "Mismatched source start offset");
                AssertMsg(this->m_cchStartOffset == node->ichMin, "Mismatched source character start offset");
                AssertMsg(this->m_cchLength == node->LengthInCodepoints(), "Mismatched source length");
                AssertMsg(this->LengthInBytes() == node->LengthInBytes(), "Mismatched source encoded byte length");
            }

            AssertMsg(this->m_isEval == isEval, "Mismatched source type");
            AssertMsg(this->m_isDynamicFunction == isDynamicFunction, "Mismatch source type");
       }
#endif

#if DBG_DUMP
        if (PHASE_TRACE1(Js::FunctionSourceInfoParsePhase))
        {
            Assert(this->GetFunctionInfo()->HasBody());
            if (this->IsFunctionBody())
            {
                FunctionBody* functionBody = this->GetFunctionBody();
                Assert( functionBody != nullptr );

                functionBody->PrintStatementSourceLineFromStartOffset(functionBody->StartInDocument());
                Output::Flush();
            }
        }
#endif
    }